

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_diag.c
# Opt level: O1

int CVDiagB(void *cvode_mem,int which)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    iVar3 = -1;
    cvode_mem = (CVodeMem)0x0;
    error_code = -1;
    iVar1 = 0x1e9;
  }
  else if (*(int *)((long)cvode_mem + 0xa78) == 0) {
    msgfmt = "Illegal attempt to call before calling CVodeAdjMalloc.";
    iVar3 = -0x65;
    error_code = -0x65;
    iVar1 = 0x1f2;
  }
  else {
    if (which < *(int *)(*(long *)((long)cvode_mem + 0xa70) + 0x38)) {
      for (piVar2 = *(int **)(*(long *)((long)cvode_mem + 0xa70) + 0x30);
          (piVar2 != (int *)0x0 && (*piVar2 != which)); piVar2 = *(int **)(piVar2 + 0x1e)) {
      }
      iVar1 = CVDiag(*(void **)(piVar2 + 4));
      return iVar1;
    }
    msgfmt = "Illegal value for which.";
    iVar3 = -3;
    error_code = -3;
    iVar1 = 0x1fb;
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar1,"CVDiagB",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_diag.c"
                 ,msgfmt);
  return iVar3;
}

Assistant:

int CVDiagB(void* cvode_mem, int which)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  void* cvodeB_mem;
  int flag;

  /* Check if cvode_mem exists */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVDIAG_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGDG_CVMEM_NULL);
    return (CVDIAG_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Was ASA initialized? */
  if (cv_mem->cv_adjMallocDone == SUNFALSE)
  {
    cvProcessError(cv_mem, CVDIAG_NO_ADJ, __LINE__, __func__, __FILE__,
                   MSGDG_NO_ADJ);
    return (CVDIAG_NO_ADJ);
  }
  ca_mem = cv_mem->cv_adj_mem;

  /* Check which */
  if (which >= ca_mem->ca_nbckpbs)
  {
    cvProcessError(cv_mem, CVDIAG_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGDG_BAD_WHICH);
    return (CVDIAG_ILL_INPUT);
  }

  /* Find the CVodeBMem entry in the linked list corresponding to which */
  cvB_mem = ca_mem->cvB_mem;
  while (cvB_mem != NULL)
  {
    if (which == cvB_mem->cv_index) { break; }
    cvB_mem = cvB_mem->cv_next;
  }

  cvodeB_mem = (void*)(cvB_mem->cv_mem);

  flag = CVDiag(cvodeB_mem);

  return (flag);
}